

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O1

wchar_t get_use_device_chance(object *obj)

{
  int iVar1;
  wchar_t *pwVar2;
  int iVar3;
  int iVar4;
  
  if (obj->artifact == (artifact *)0x0) {
    if (obj->activation == (activation *)0x0) {
      pwVar2 = &obj->kind->level;
    }
    else {
      pwVar2 = &obj->activation->level;
    }
  }
  else {
    pwVar2 = &obj->artifact->level;
  }
  iVar3 = (player->state).skills[2] - *pwVar2;
  iVar1 = iVar3 * 2 + 1;
  iVar4 = -iVar1;
  if (-1 < iVar3) {
    iVar4 = iVar1;
  }
  return (iVar1 * -0x172) / (iVar4 + 5) + L'ż';
}

Assistant:

int get_use_device_chance(const struct object *obj)
{
	int lev, fail, x;
	int skill = player->state.skills[SKILL_DEVICE];

	/* Extract the item level, which is the difficulty rating */
	lev = obj->artifact ? obj->artifact->level :
		(obj->activation ? obj->activation->level : obj->kind->level);

	/* Calculate x */
	x = 2 * (skill - lev) + 1;

	/* Now calculate the failure rate */
	fail = -370 * x;
	fail /= (5 + ABS(x));
	fail += 380;

	return fail;
}